

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

PatternList *
parse_long(PatternList *__return_storage_ptr__,Tokens *tokens,
          vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar1;
  __type_conflict _Var2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  size_type sVar6;
  iterator iter;
  OptionError *pOVar7;
  element_type *peVar8;
  string *psVar9;
  string *in_R8;
  shared_ptr<docopt::Pattern> local_3f8;
  value local_3e8;
  string local_3c0;
  value local_3a0;
  undefined1 local_378 [8];
  string error_2;
  string *token;
  string error_1;
  shared_ptr<docopt::Option> o_1;
  value local_310;
  undefined1 local_2e8 [8];
  shared_ptr<docopt::Option> o;
  int argcount;
  undefined8 local_2b0;
  undefined8 local_2a8;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [8];
  string error;
  undefined1 local_230 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prefixes;
  Option *local_210;
  reference local_208;
  Option *option_1;
  iterator __end2;
  iterator __begin2;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *__range2;
  reference local_1e0;
  Option *option;
  iterator __end1;
  iterator __begin1;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *__range1;
  vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> similar;
  allocator local_179;
  string local_178;
  tuple<std::__cxx11::string&,std::__cxx11::string&,docopt::value&> local_158 [31];
  allocator local_139;
  string local_138;
  string local_118;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  undefined1 local_88 [8];
  value val;
  string equal;
  string longOpt;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *options_local;
  Tokens *tokens_local;
  PatternList *ret;
  
  std::__cxx11::string::string((string *)(equal.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)((long)&val.variant + 0x18));
  docopt::value::value((value *)local_88);
  Tokens::pop_abi_cxx11_(&local_118,tokens);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"=",&local_139);
  anon_unknown.dwarf_47ccc::partition(&local_f8,&local_118,&local_138);
  std::tie<std::__cxx11::string,std::__cxx11::string,docopt::value>
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_docopt::value_&>
              *)local_158,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&equal.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&val.variant + 0x18),(value *)local_88);
  std::tuple<std::__cxx11::string&,std::__cxx11::string&,docopt::value&>::operator=
            (local_158,&local_f8);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple(&local_f8);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"--",&local_179);
  bVar1 = anon_unknown.dwarf_47ccc::starts_with((string *)((long)&equal.field_2 + 8),&local_178);
  if (!bVar1) {
    __assert_fail("starts_with(longOpt, \"--\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/nsearch/vendor/docopt/docopt.cpp"
                  ,0xd9,"PatternList parse_long(Tokens &, std::vector<Option> &)");
  }
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    docopt::value::value
              ((value *)&similar.
                         super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    docopt::value::operator=
              ((value *)local_88,
               (value *)&similar.
                         super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    docopt::value::~value
              ((value *)&similar.
                         super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::vector
            ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)&__range1);
  __end1 = std::vector<docopt::Option,_std::allocator<docopt::Option>_>::begin(options);
  option = (Option *)std::vector<docopt::Option,_std::allocator<docopt::Option>_>::end(options);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<docopt::Option_*,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
                                     *)&option), bVar1) {
    local_1e0 = __gnu_cxx::
                __normal_iterator<docopt::Option_*,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
                ::operator*(&__end1);
    psVar9 = docopt::Option::longOption_abi_cxx11_(local_1e0);
    _Var2 = std::operator==(psVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&equal.field_2 + 8));
    if (_Var2) {
      __range2 = (vector<docopt::Option,_std::allocator<docopt::Option>_> *)local_1e0;
      std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::push_back
                ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)
                 &__range1,(value_type *)&__range2);
    }
    __gnu_cxx::
    __normal_iterator<docopt::Option_*,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
    ::operator++(&__end1);
  }
  bVar1 = Tokens::isParsingArgv(tokens);
  if ((bVar1) &&
     (bVar1 = std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::empty
                        ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)
                         &__range1), bVar1)) {
    __end2 = std::vector<docopt::Option,_std::allocator<docopt::Option>_>::begin(options);
    option_1 = (Option *)std::vector<docopt::Option,_std::allocator<docopt::Option>_>::end(options);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<docopt::Option_*,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
                                       *)&option_1), bVar1) {
      local_208 = __gnu_cxx::
                  __normal_iterator<docopt::Option_*,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
                  ::operator*(&__end2);
      docopt::Option::longOption_abi_cxx11_(local_208);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        psVar9 = docopt::Option::longOption_abi_cxx11_(local_208);
        bVar1 = anon_unknown.dwarf_47ccc::starts_with(psVar9,(string *)((long)&equal.field_2 + 8));
        if (bVar1) {
          local_210 = local_208;
          std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::push_back
                    ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)
                     &__range1,&local_210);
        }
      }
      __gnu_cxx::
      __normal_iterator<docopt::Option_*,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
      ::operator++(&__end2);
    }
  }
  prefixes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector(__return_storage_ptr__);
  sVar6 = std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::size
                    ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)
                     &__range1);
  if (1 < sVar6) {
    iter = std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::begin
                     ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)
                      &__range1);
    error.field_2._8_8_ =
         std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::end
                   ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)
                    &__range1);
    longOptions<__gnu_cxx::__normal_iterator<docopt::Option_const**,std::vector<docopt::Option_const*,std::allocator<docopt::Option_const*>>>>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_230,
               (__normal_iterator<const_docopt::Option_**,_std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>_>
                )iter._M_current,
               (__normal_iterator<const_docopt::Option_**,_std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>_>
                )error.field_2._8_8_);
    std::operator+(&local_280,"\'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&equal.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                   &local_280,"\' is not a unique prefix: ");
    std::__cxx11::string::~string((string *)&local_280);
    local_2a8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_230);
    local_2b0 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_230);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&argcount,", ",
               (allocator *)
               ((long)&o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi + 7));
    (anonymous_namespace)::
    join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&local_2a0,(_anonymous_namespace_ *)local_2a8,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_2b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&argcount,in_R8)
    ;
    std::__cxx11::string::append((string *)local_260);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&argcount);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi + 7));
    pOVar7 = (OptionError *)__cxa_allocate_exception(0x10);
    Tokens::OptionError::runtime_error(pOVar7,(string *)local_260);
    __cxa_throw(pOVar7,&Tokens::OptionError::typeinfo,Tokens::OptionError::~OptionError);
  }
  bVar1 = std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::empty
                    ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)
                     &__range1);
  if (bVar1) {
    bVar3 = std::__cxx11::string::empty();
    o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         (uint)(bVar3 ^ 1);
    std::vector<docopt::Option,std::allocator<docopt::Option>>::
    emplace_back<char_const(&)[1],std::__cxx11::string&,int&>
              ((vector<docopt::Option,std::allocator<docopt::Option>> *)options,
               (char (*) [1])0x20edad,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&equal.field_2 + 8),
               (int *)&o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::vector<docopt::Option,_std::allocator<docopt::Option>_>::back(options);
    std::make_shared<docopt::Option,docopt::Option&>((Option *)local_2e8);
    bVar1 = Tokens::isParsingArgv(tokens);
    if (bVar1) {
      peVar8 = std::__shared_ptr_access<docopt::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<docopt::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_2e8);
      if ((uint)o.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          == 0) {
        docopt::value::value(&local_310,true);
      }
      else {
        docopt::value::value(&local_310,(value *)local_88);
      }
      docopt::LeafPattern::setValue(&peVar8->super_LeafPattern,&local_310);
      docopt::value::~value(&local_310);
    }
    this = &o_1.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<docopt::Pattern>::shared_ptr<docopt::Option,void>
              ((shared_ptr<docopt::Pattern> *)this,(shared_ptr<docopt::Option> *)local_2e8);
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    push_back(__return_storage_ptr__,(value_type *)this);
    std::shared_ptr<docopt::Pattern>::~shared_ptr
              ((shared_ptr<docopt::Pattern> *)
               &o_1.super___shared_ptr<docopt::Option,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<docopt::Option>::~shared_ptr((shared_ptr<docopt::Option> *)local_2e8);
  }
  else {
    std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::operator[]
              ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)&__range1,
               0);
    std::make_shared<docopt::Option,docopt::Option_const&>((Option *)((long)&error_1.field_2 + 8));
    peVar8 = std::__shared_ptr_access<docopt::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<docopt::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(error_1.field_2._M_local_buf + 8));
    iVar4 = docopt::Option::argCount(peVar8);
    if (iVar4 == 0) {
      bVar1 = docopt::value::operator_cast_to_bool((value *)local_88);
      if (bVar1) {
        peVar8 = std::__shared_ptr_access<docopt::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<docopt::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(error_1.field_2._M_local_buf + 8));
        psVar9 = docopt::Option::longOption_abi_cxx11_(peVar8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&token,
                       psVar9," must not have an argument");
        pOVar7 = (OptionError *)__cxa_allocate_exception(0x10);
        Tokens::OptionError::runtime_error(pOVar7,(string *)&token);
        __cxa_throw(pOVar7,&Tokens::OptionError::typeinfo,Tokens::OptionError::~OptionError);
      }
    }
    else {
      bVar1 = docopt::value::operator_cast_to_bool((value *)local_88);
      if (!bVar1) {
        error_2.field_2._8_8_ = Tokens::current_abi_cxx11_(tokens);
        uVar5 = std::__cxx11::string::empty();
        if (((uVar5 & 1) != 0) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)error_2.field_2._8_8_,"--"), bVar1)) {
          peVar8 = std::
                   __shared_ptr_access<docopt::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<docopt::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(error_1.field_2._M_local_buf + 8));
          psVar9 = docopt::Option::longOption_abi_cxx11_(peVar8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_378,psVar9," requires an argument");
          pOVar7 = (OptionError *)__cxa_allocate_exception(0x10);
          Tokens::OptionError::runtime_error(pOVar7,(string *)local_378);
          __cxa_throw(pOVar7,&Tokens::OptionError::typeinfo,Tokens::OptionError::~OptionError);
        }
        Tokens::pop_abi_cxx11_(&local_3c0,tokens);
        docopt::value::value(&local_3a0,&local_3c0);
        docopt::value::operator=((value *)local_88,&local_3a0);
        docopt::value::~value(&local_3a0);
        std::__cxx11::string::~string((string *)&local_3c0);
      }
    }
    bVar1 = Tokens::isParsingArgv(tokens);
    if (bVar1) {
      peVar8 = std::__shared_ptr_access<docopt::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<docopt::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(error_1.field_2._M_local_buf + 8));
      bVar1 = docopt::value::operator_cast_to_bool((value *)local_88);
      if (bVar1) {
        docopt::value::value(&local_3e8,(value *)local_88);
      }
      else {
        docopt::value::value(&local_3e8,true);
      }
      docopt::LeafPattern::setValue(&peVar8->super_LeafPattern,&local_3e8);
      docopt::value::~value(&local_3e8);
    }
    std::shared_ptr<docopt::Pattern>::shared_ptr<docopt::Option,void>
              (&local_3f8,(shared_ptr<docopt::Option> *)((long)&error_1.field_2 + 8));
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    push_back(__return_storage_ptr__,&local_3f8);
    std::shared_ptr<docopt::Pattern>::~shared_ptr(&local_3f8);
    std::shared_ptr<docopt::Option>::~shared_ptr
              ((shared_ptr<docopt::Option> *)((long)&error_1.field_2 + 8));
  }
  prefixes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>::~vector
            ((vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> *)&__range1);
  docopt::value::~value((value *)local_88);
  std::__cxx11::string::~string((string *)((long)&val.variant + 0x18));
  std::__cxx11::string::~string((string *)(equal.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

static PatternList parse_long(Tokens& tokens, std::vector<Option>& options)
{
	// long ::= '--' chars [ ( ' ' | '=' ) chars ] ;
	std::string longOpt, equal;
	value val;
	std::tie(longOpt, equal, val) = partition(tokens.pop(), "=");

	assert(starts_with(longOpt, "--"));

	if (equal.empty()) {
		val = value{};
	}

	// detect with options match this long option
	std::vector<Option const*> similar;
	for(auto const& option : options) {
		if (option.longOption()==longOpt)
			similar.push_back(&option);
	}

	// maybe allow similar options that match by prefix
	if (tokens.isParsingArgv() && similar.empty()) {
		for(auto const& option : options) {
			if (option.longOption().empty())
				continue;
			if (starts_with(option.longOption(), longOpt))
				similar.push_back(&option);
		}
	}

	PatternList ret;

	if (similar.size() > 1) { // might be simply specified ambiguously 2+ times?
		std::vector<std::string> prefixes = longOptions(similar.begin(), similar.end());
		std::string error = "'" + longOpt + "' is not a unique prefix: ";
		error.append(join(prefixes.begin(), prefixes.end(), ", "));
		throw Tokens::OptionError(std::move(error));
	} else if (similar.empty()) {
		int argcount = equal.empty() ? 0 : 1;
		options.emplace_back("", longOpt, argcount);

		auto o = std::make_shared<Option>(options.back());
		if (tokens.isParsingArgv()) {
			o->setValue(argcount ? value{val} : value{true});
		}
		ret.push_back(o);
	} else {
		auto o = std::make_shared<Option>(*similar[0]);
		if (o->argCount() == 0) {
			if (val) {
				std::string error = o->longOption() + " must not have an argument";
				throw Tokens::OptionError(std::move(error));
			}
		} else {
			if (!val) {
				auto const& token = tokens.current();
				if (token.empty() || token=="--") {
					std::string error = o->longOption() + " requires an argument";
					throw Tokens::OptionError(std::move(error));
				}
				val = tokens.pop();
			}
		}
		if (tokens.isParsingArgv()) {
			o->setValue(val ? std::move(val) : value{true});
		}
		ret.push_back(o);
	}

	return ret;
}